

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void __thiscall
ftxui::(anonymous_namespace)::
compose(std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>,std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>)
::$_0::~__0(__0 *this)

{
  anon_class_64_2_9473e8c0 *this_local;
  
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
            ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)(this + 0x20))
  ;
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
            ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)this);
  return;
}

Assistant:

Decorator compose(Decorator a, Decorator b) {
  return [a = std::move(a), b = std::move(b)](Element element) {
    return b(a(std::move(element)));
  };
}